

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::IntegerLiteral::getEffectiveSignImpl(IntegerLiteral *this,bool isForConversion)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  byte in_SIL;
  SVInt *val;
  IntegerLiteral *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc4;
  SVInt local_30;
  SVInt *local_20;
  byte local_11;
  EffectiveSign local_4;
  
  local_11 = in_SIL & 1;
  getValue(in_stack_ffffffffffffffa8);
  local_20 = &local_30;
  if ((local_11 & 1) == 0) {
    bVar1 = SVInt::hasUnknown(local_20);
    if (!bVar1) {
      bVar2 = SVInt::getActiveBits
                        ((SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      bVar3 = SVInt::getBitWidth(local_20);
      if (bVar2 == bVar3) goto LAB_00b8bf68;
    }
    local_4 = Either;
  }
  else {
LAB_00b8bf68:
    bVar1 = SVInt::isSigned(local_20);
    local_4 = (EffectiveSign)bVar1;
  }
  SVInt::~SVInt((SVInt *)CONCAT44(in_stack_ffffffffffffffc4,1));
  return local_4;
}

Assistant:

Expression::EffectiveSign IntegerLiteral::getEffectiveSignImpl(bool isForConversion) const {
    // We will say that this literal could have been signed if doing
    // so would not change its logical value (i.e. it either already
    // was marked signed, or it's a positive value that would remain
    // positive given a cast to a signed type).
    //
    // We will not warn if the value contains unknowns -- the rationale
    // is that signed-related warnings make no sense in those cases, though
    // we should probably warn separately about the unknowns themselves.
    auto&& val = getValue();
    if (isForConversion || (!val.hasUnknown() && val.getActiveBits() == val.getBitWidth())) {
        return val.isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
    }

    return EffectiveSign::Either;
}